

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_DeleteReferences
               (UA_Server *server,UA_Session *session,UA_DeleteReferencesRequest *request,
               UA_DeleteReferencesResponse *response)

{
  UA_StatusCode UVar1;
  UA_StatusCode *pUVar2;
  size_t sVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  sVar3 = request->referencesToDeleteSize;
  if (sVar3 == 0) {
    UVar1 = 0x800f0000;
  }
  else {
    pUVar2 = (UA_StatusCode *)malloc(sVar3 * 4);
    response->results = pUVar2;
    if (pUVar2 != (UA_StatusCode *)0x0) {
      response->resultsSize = sVar3;
      lVar4 = 0;
      for (uVar5 = 0; uVar5 < sVar3; uVar5 = uVar5 + 1) {
        UVar1 = deleteReference(server,session,
                                (UA_DeleteReferencesItem *)
                                ((long)&(request->referencesToDelete->sourceNodeId).namespaceIndex +
                                lVar4));
        response->results[uVar5] = UVar1;
        sVar3 = request->referencesToDeleteSize;
        lVar4 = lVar4 + 0x70;
      }
      return;
    }
    UVar1 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar1;
  return;
}

Assistant:

void
Service_DeleteReferences(UA_Server *server, UA_Session *session,
                         const UA_DeleteReferencesRequest *request,
                         UA_DeleteReferencesResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteReferencesRequest");
    if(request->referencesToDeleteSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    response->results = UA_malloc(sizeof(UA_StatusCode) * request->referencesToDeleteSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;;
        return;
    }
    response->resultsSize = request->referencesToDeleteSize;

    for(size_t i = 0; i < request->referencesToDeleteSize; ++i)
        response->results[i] =
            deleteReference(server, session, &request->referencesToDelete[i]);
}